

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestVerifyInt32::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestVerifyInt32 **v1;
  TestVerifyInt32 **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<edition_unittest::TestAllTypes> *this;
  RepeatedPtrField<edition_unittest::TestAllTypes> *other;
  uint32_t *puVar3;
  TestAllTypes *pTVar4;
  LogMessage local_90;
  Voidify local_79;
  uint local_78;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  TestVerifyInt32 *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestVerifyInt32 *from;
  TestVerifyInt32 *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestVerifyInt32 *)to_msg;
  _this = (TestVerifyInt32 *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_50 = (TestVerifyInt32 *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestVerifyInt32_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<edition_unittest::TestVerifyInt32*>
                 (&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestVerifyInt32_const*,edition_unittest::TestVerifyInt32*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0xbcbf,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  local_78 = 0;
  this = _internal_mutable_repeated_all_types(from);
  other = _internal_repeated_all_types((TestVerifyInt32 *)arena);
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes>::MergeFrom(this,other);
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_78 = *puVar3;
  if ((local_78 & 0x1f) != 0) {
    if ((local_78 & 1) != 0) {
      if ((arena->impl_).first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0xbcc8,"from._impl_.optional_all_types_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_90);
      }
      if ((from->field_0)._impl_.optional_all_types_ == (TestAllTypes *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.ptr_._M_b._M_p;
        local_10 = absl_log_internal_check_op_result;
        pTVar4 = (TestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.optional_all_types_ = pTVar4;
      }
      else {
        edition_unittest::TestAllTypes::MergeFrom
                  ((from->field_0)._impl_.optional_all_types_,
                   (TestAllTypes *)(arena->impl_).first_arena_.ptr_._M_b._M_p);
      }
    }
    if ((local_78 & 2) != 0) {
      (from->field_0)._impl_.optional_int32_1_ = *(int32_t *)&(arena->impl_).first_arena_.limit_;
    }
    if ((local_78 & 4) != 0) {
      (from->field_0)._impl_.optional_int32_2_ =
           *(int32_t *)((long)&(arena->impl_).first_arena_.limit_ + 4);
    }
    if ((local_78 & 8) != 0) {
      (from->field_0)._impl_.optional_int32_63_ =
           *(int32_t *)&(arena->impl_).first_arena_.prefetch_ptr_;
    }
    if ((local_78 & 0x10) != 0) {
      (from->field_0)._impl_.optional_int32_64_ =
           *(int32_t *)((long)&(arena->impl_).first_arena_.prefetch_ptr_ + 4);
    }
  }
  uVar1 = local_78;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestVerifyInt32::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestVerifyInt32*>(&to_msg);
  auto& from = static_cast<const TestVerifyInt32&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestVerifyInt32)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_all_types()->MergeFrom(
      from._internal_repeated_all_types());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.optional_all_types_ != nullptr);
      if (_this->_impl_.optional_all_types_ == nullptr) {
        _this->_impl_.optional_all_types_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_all_types_);
      } else {
        _this->_impl_.optional_all_types_->MergeFrom(*from._impl_.optional_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_int32_1_ = from._impl_.optional_int32_1_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.optional_int32_2_ = from._impl_.optional_int32_2_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.optional_int32_63_ = from._impl_.optional_int32_63_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_int32_64_ = from._impl_.optional_int32_64_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}